

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatZero(SUNMatrix A,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix A_00;
  double dVar3;
  double dVar4;
  SUNMatrix B;
  realtype tol;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  SUNMatrix A_local;
  
  A_00 = SUNMatClone(A);
  dVar3 = get_time();
  uVar1 = SUNMatZero(A_00);
  dVar4 = get_time();
  if (uVar1 == 0) {
    iVar2 = check_matrix_entry(A_00,0.0,2.220446049250313e-15);
    if (iVar2 == 0) {
      if ((myid == 0) && (printf("    PASSED test -- SUNMatZero \n"), print_time != 0)) {
        printf("    SUNMatZero Time: %22.15e \n \n",dVar4 - dVar3);
      }
      SUNMatDestroy(A_00);
      A_local._4_4_ = 0;
    }
    else {
      printf(">>> FAILED test -- SUNMatZero check, Proc %d \n",(ulong)(uint)myid);
      if (print_time != 0) {
        printf("    SUNMatZero Time: %22.15e \n \n",dVar4 - dVar3);
      }
      SUNMatDestroy(A_00);
      A_local._4_4_ = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNMatZero returned %d on Proc %d \n",(ulong)uVar1,(ulong)(uint)myid)
    ;
    SUNMatDestroy(A_00);
    A_local._4_4_ = 1;
  }
  return A_local._4_4_;
}

Assistant:

int Test_SUNMatZero(SUNMatrix A, int myid)
{
  int       failure;
  double    start_time, stop_time;
  realtype  tol=10*UNIT_ROUNDOFF;
  SUNMatrix B;

  /* protect A */
  B = SUNMatClone(A);

  /* set matrix data to zero */
  start_time = get_time();
  failure = SUNMatZero(B);
  stop_time = get_time();

  if (failure) {
    printf(">>> FAILED test -- SUNMatZero returned %d on Proc %d \n",
           failure, myid);
    SUNMatDestroy(B);
    return(1);
  }

  /* A data should be a vector of zeros */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure) {
    printf(">>> FAILED test -- SUNMatZero check, Proc %d \n", myid);
    PRINT_TIME("    SUNMatZero Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNMatZero \n");
    PRINT_TIME("    SUNMatZero Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return(0);
}